

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidatorFactory.cpp
# Opt level: O0

ValidatorType xercesc_4_0::getPrimitiveDV(ValidatorType validationDV)

{
  undefined4 local_c;
  ValidatorType validationDV_local;
  
  if (((validationDV == ID) || (validationDV == IDREF)) ||
     (local_c = validationDV, validationDV == ENTITY)) {
    local_c = String;
  }
  return local_c;
}

Assistant:

static DatatypeValidator::ValidatorType getPrimitiveDV(DatatypeValidator::ValidatorType validationDV)
{
    if (validationDV == DatatypeValidator::ID    ||
        validationDV == DatatypeValidator::IDREF ||
        validationDV == DatatypeValidator::ENTITY)
    {
        return DatatypeValidator::String;
    }
    return validationDV;
}